

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

bool EV_OpenPolyDoor(line_t_conflict *line,int polyNum,double speed,DAngle *angle,int delay,
                    double distance,podoortype_t type)

{
  double dVar1;
  bool bVar2;
  FPolyObj *pFVar3;
  size_t len;
  TVector2<double> local_220 [2];
  undefined1 local_200 [8];
  FPolyMirrorIterator it;
  int swingdir;
  FPolyObj *poly;
  DPolyDoor *pd;
  podoortype_t type_local;
  double distance_local;
  int delay_local;
  DAngle *angle_local;
  double speed_local;
  int polyNum_local;
  line_t_conflict *line_local;
  
  poly = (FPolyObj *)0x0;
  it._412_4_ = 1;
  pFVar3 = PO_GetPolyobj(polyNum);
  if (pFVar3 == (FPolyObj *)0x0) {
    Printf("EV_OpenPolyDoor: Invalid polyobj num: %d\n",(ulong)(uint)polyNum);
    line_local._7_1_ = false;
  }
  else {
    FPolyMirrorIterator::FPolyMirrorIterator((FPolyMirrorIterator *)local_200,pFVar3);
    while (pFVar3 = FPolyMirrorIterator::NextMirror((FPolyMirrorIterator *)local_200),
          pFVar3 != (FPolyObj *)0x0) {
      len = 0;
      bVar2 = TObjPtr<DPolyAction>::operator!=(&pFVar3->specialdata,(DPolyAction *)0x0);
      if (((bVar2) || ((pFVar3->bBlocked & 1U) != 0)) ||
         ((pFVar3->bHasPortals == '\x02' && (type == PODOOR_SWING)))) break;
      poly = (FPolyObj *)DObject::operator_new((DObject *)0x90,len);
      DPolyDoor::DPolyDoor((DPolyDoor *)poly,pFVar3->tag,type);
      TObjPtr<DPolyAction>::operator=(&pFVar3->specialdata,(DPolyAction *)poly);
      if (type == PODOOR_SLIDE) {
        *(int *)((long)(poly->Bounds).m_Box + 0x14) = delay;
        (poly->PrevPts).Array = (FPolyVertex *)speed;
        (poly->Bounds).m_Box[1] = distance;
        *(double *)&(poly->PrevPts).Most = distance;
        TAngle<double>::operator=((TAngle<double> *)&poly->Bounds,angle);
        TAngle<double>::ToVector((TAngle<double> *)local_220,speed);
        TVector2<double>::operator=(&(poly->CenterSpot).pos,local_220);
        SN_StartSequence(pFVar3,pFVar3->seqType,SEQ_DOOR,0,false);
        TAngle<double>::operator+=(angle,180.0);
      }
      else if (type == PODOOR_SWING) {
        *(int *)((long)(poly->Bounds).m_Box + 0x14) = delay;
        (poly->Bounds).m_Box[0] = (double)(int)it._412_4_;
        (poly->PrevPts).Array = (FPolyVertex *)((speed * (double)(int)it._412_4_ * 1.40625) / 8.0);
        dVar1 = angle->Degrees;
        (poly->Bounds).m_Box[1] = dVar1;
        *(double *)&(poly->PrevPts).Most = dVar1;
        SN_StartSequence(pFVar3,pFVar3->seqType,SEQ_DOOR,0,false);
        it._412_4_ = -it._412_4_;
      }
    }
    line_local._7_1_ = poly != (FPolyObj *)0x0;
  }
  return line_local._7_1_;
}

Assistant:

bool EV_OpenPolyDoor(line_t *line, int polyNum, double speed, DAngle angle, int delay, double distance, podoortype_t type)
{
	DPolyDoor *pd = NULL;
	FPolyObj *poly;
	int swingdir = 1;	// ADD:  PODOOR_SWINGL, PODOOR_SWINGR

	if ((poly = PO_GetPolyobj(polyNum)) == NULL)
	{
		Printf("EV_OpenPolyDoor: Invalid polyobj num: %d\n", polyNum);
		return false;
	}
	FPolyMirrorIterator it(poly);

	while ((poly = it.NextMirror()) != NULL)
	{
		if ((poly->specialdata != NULL || poly->bBlocked))
		{ // poly is already moving
			break;
		}
		if (poly->bHasPortals == 2 && type == PODOOR_SWING)
		{
			// cannot do rotations on linked polyportals.
			break;
		}

		pd = new DPolyDoor(poly->tag, type);
		poly->specialdata = pd;
		if (type == PODOOR_SLIDE)
		{
			pd->m_WaitTics = delay;
			pd->m_Speed = speed;
			pd->m_Dist = pd->m_TotalDist = distance; // Distance
			pd->m_Direction = angle;
			pd->m_Speedv = angle.ToVector(speed);
			SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);
			angle += 180.;	// reverse the angle
		}
		else if (type == PODOOR_SWING)
		{
			pd->m_WaitTics = delay;
			pd->m_Direction.Degrees = swingdir; 
			pd->m_Speed = (speed*swingdir*(90. / 64)) / 8;
			pd->m_Dist = pd->m_TotalDist = angle.Degrees;
			SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);
			swingdir = -swingdir;	// reverse the direction
		}

	}
	return pd != NULL;	// Return true if something started moving.
}